

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi__zhuffman *z_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  stbi_uc sVar9;
  int iVar10;
  stbi_uc *psVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar6 = a->zbuffer;
    uVar1 = 0;
    if (pbVar6 < a->zbuffer_end) {
      a->zbuffer = pbVar6 + 1;
      uVar2 = (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar6 < a->zbuffer_end) {
      a->zbuffer = pbVar6 + 1;
      uVar1 = (uint)*pbVar6;
    }
    if ((short)((uVar2 << 8 | uVar1) % 0x1f) == 0) {
      if ((uVar1 & 0x20) == 0) {
        if ((uVar2 & 0xf) == 8) goto LAB_001125e2;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
    return 0;
  }
LAB_001125e2:
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  z_00 = &a->z_distance;
LAB_00112614:
  uVar1 = stbi__zreceive(a,1);
  uVar2 = stbi__zreceive(a,2);
  if (uVar2 != 0) {
    if (uVar2 != 1) {
      if (uVar2 == 3) {
        return 0;
      }
      uVar2 = stbi__zreceive(a,5);
      uVar3 = stbi__zreceive(a,5);
      uVar4 = stbi__zreceive(a,4);
      local_a08[0] = '\0';
      local_a08[1] = '\0';
      local_a08[2] = '\0';
      local_a08[3] = '\0';
      local_a08[4] = '\0';
      local_a08[5] = '\0';
      local_a08[6] = '\0';
      local_a08[7] = '\0';
      local_a08[8] = '\0';
      local_a08[9] = '\0';
      local_a08[10] = '\0';
      local_a08[0xb] = '\0';
      local_a08[0xc] = '\0';
      local_a08[0xd] = '\0';
      local_a08[0xe] = '\0';
      local_a08[0xf] = '\0';
      local_a08[0x10] = '\0';
      local_a08[0x11] = '\0';
      local_a08[0x12] = '\0';
      uVar7 = (ulong)(uVar4 + 4);
      if ((int)(uVar4 + 4) < 1) {
        uVar7 = 0;
      }
      for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        uVar4 = stbi__zreceive(a,3);
        local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar14]] =
             (stbi_uc)uVar4;
      }
      iVar5 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
      if (iVar5 == 0) {
        return 0;
      }
      iVar10 = uVar2 + 0x101;
      iVar13 = uVar3 + 1 + iVar10;
      iVar5 = 0;
LAB_0011273a:
      do {
        if (iVar13 <= iVar5) goto LAB_001128d8;
        uVar2 = stbi__zhuffman_decode(a,&z_codelength);
        if (0x12 < uVar2) goto LAB_00112b15;
        if (uVar2 < 0x10) {
          lencodes[iVar5] = (stbi_uc)uVar2;
          iVar5 = iVar5 + 1;
          goto LAB_0011273a;
        }
        if (uVar2 == 0x11) {
          uVar2 = stbi__zreceive(a,3);
          uVar4 = 0;
        }
        else {
          if (uVar2 != 0x10) {
            uVar2 = stbi__zreceive(a,7);
            memset(lencodes + iVar5,0,(long)(int)(uVar2 + 0xb));
            iVar5 = iVar5 + uVar2 + 0xb;
            goto LAB_0011273a;
          }
          uVar2 = stbi__zreceive(a,2);
          uVar4 = (uint)lencodes[(long)iVar5 + -1];
        }
        memset(lencodes + iVar5,uVar4,(long)(int)(uVar2 + 3));
        iVar5 = iVar5 + uVar2 + 3;
      } while( true );
    }
    if (stbi__zdefault_distance[0x1f] == '\0') {
      for (lVar8 = 0; lVar8 != 0x90; lVar8 = lVar8 + 1) {
        stbi__zdefault_length[lVar8] = '\b';
      }
      for (lVar8 = 0; lVar8 != 0x70; lVar8 = lVar8 + 1) {
        stbi__zdefault_length[lVar8 + 0x90] = '\t';
      }
      for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
        stbi__zdefault_length[lVar8 + 0x100] = '\a';
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        stbi__zdefault_length[lVar8 + 0x118] = '\b';
      }
      for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
        stbi__zdefault_distance[lVar8] = '\x05';
      }
    }
    iVar5 = stbi__zbuild_huffman(z,stbi__zdefault_length,0x120);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = stbi__zbuild_huffman(z_00,stbi__zdefault_distance,0x20);
    if (iVar5 == 0) {
      return 0;
    }
    goto LAB_0011292a;
  }
  uVar2 = a->num_bits;
  if ((uVar2 & 7) != 0) {
    stbi__zreceive(a,uVar2 & 7);
    uVar2 = a->num_bits;
  }
  uVar7 = 0;
  while (0 < (int)uVar2) {
    uVar3 = a->code_buffer;
    *(char *)((long)z_codelength.fast + uVar7) = (char)uVar3;
    uVar7 = uVar7 + 1;
    a->code_buffer = uVar3 >> 8;
    uVar2 = uVar2 - 8;
    a->num_bits = uVar2;
  }
  if (uVar2 != 0) {
    __assert_fail("a->num_bits == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/stb_image.h"
                  ,0xebc,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
  }
  for (; uVar7 < 4; uVar7 = uVar7 + 1) {
    psVar11 = a->zbuffer;
    if (psVar11 < a->zbuffer_end) {
      a->zbuffer = psVar11 + 1;
      sVar9 = *psVar11;
    }
    else {
      sVar9 = '\0';
    }
    *(stbi_uc *)((long)z_codelength.fast + uVar7) = sVar9;
  }
  if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) {
    stbi__g_failure_reason = "zlib corrupt";
    return 0;
  }
  psVar11 = a->zbuffer;
  uVar7 = (ulong)z_codelength.fast[0];
  if (a->zbuffer_end < psVar11 + uVar7) {
    stbi__g_failure_reason = "read past buffer";
    return 0;
  }
  pcVar12 = a->zout;
  if (a->zout_end < pcVar12 + uVar7) {
    iVar5 = stbi__zexpand(a,pcVar12,(uint)z_codelength.fast[0]);
    if (iVar5 == 0) {
      return 0;
    }
    psVar11 = a->zbuffer;
    pcVar12 = a->zout;
  }
  memcpy(pcVar12,psVar11,uVar7);
  a->zbuffer = a->zbuffer + uVar7;
  a->zout = a->zout + uVar7;
  goto LAB_00112aec;
LAB_001128d8:
  if (iVar5 != iVar13) {
LAB_00112b15:
    stbi__g_failure_reason = "bad codelengths";
    return 0;
  }
  iVar5 = stbi__zbuild_huffman(z,lencodes,iVar10);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = stbi__zbuild_huffman(z_00,lencodes + iVar10,uVar3 + 1);
  if (iVar5 == 0) {
    return 0;
  }
LAB_0011292a:
  pcVar12 = a->zout;
  while( true ) {
    while (iVar5 = stbi__zhuffman_decode(a,z), iVar5 < 0x100) {
      if (iVar5 < 0) goto LAB_00112b03;
      if (a->zout_end <= pcVar12) {
        iVar10 = stbi__zexpand(a,pcVar12,1);
        if (iVar10 == 0) {
          return 0;
        }
        pcVar12 = a->zout;
      }
      *pcVar12 = (char)iVar5;
      pcVar12 = pcVar12 + 1;
    }
    if (iVar5 == 0x100) break;
    uVar7 = (ulong)(iVar5 - 0x101);
    uVar2 = stbi__zlength_base[uVar7];
    if (0xffffffffffffffeb < uVar7 - 0x1c) {
      uVar3 = stbi__zreceive(a,stbi__zlength_extra[uVar7]);
      uVar2 = uVar2 + uVar3;
    }
    uVar3 = stbi__zhuffman_decode(a,z_00);
    if ((int)uVar3 < 0) {
LAB_00112b03:
      stbi__g_failure_reason = "bad huffman code";
      return 0;
    }
    uVar7 = (ulong)uVar3;
    iVar5 = stbi__zdist_base[uVar7];
    if (0xffffffffffffffe5 < uVar7 - 0x1e) {
      uVar3 = stbi__zreceive(a,stbi__zdist_extra[uVar7]);
      iVar5 = iVar5 + uVar3;
    }
    if ((long)pcVar12 - (long)a->zout_start < (long)iVar5) {
      stbi__g_failure_reason = "bad dist";
      return 0;
    }
    if (a->zout_end < pcVar12 + (int)uVar2) {
      iVar10 = stbi__zexpand(a,pcVar12,uVar2);
      if (iVar10 == 0) {
        return 0;
      }
      pcVar12 = a->zout;
    }
    lVar8 = -(long)iVar5;
    if (iVar5 == 1) {
      if (uVar2 != 0) {
        memset(pcVar12,(uint)(byte)pcVar12[lVar8],(ulong)uVar2);
        pcVar12 = pcVar12 + (ulong)(uVar2 - 1) + 1;
      }
    }
    else {
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        *pcVar12 = pcVar12[lVar8];
        pcVar12 = pcVar12 + 1;
      }
    }
  }
  a->zout = pcVar12;
LAB_00112aec:
  if (uVar1 != 0) {
    return 1;
  }
  goto LAB_00112614;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}